

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void text_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  int iVar1;
  int height2;
  _rtext *x_00;
  char *tag;
  _rtext *y;
  t_text *x;
  int dy_local;
  int dx_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  *(short *)&z[2].g_next = *(short *)&z[2].g_next + (short)dx;
  *(short *)((long)&z[2].g_next + 2) = *(short *)((long)&z[2].g_next + 2) + (short)dy;
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    x_00 = glist_findrtext(glist,(t_text *)z);
    rtext_displace(x_00,glist->gl_zoom * dx,glist->gl_zoom * dy);
    tag = rtext_gettag(x_00);
    iVar1 = rtext_width(x_00);
    height2 = rtext_height(x_00);
    text_drawborder((t_text *)z,glist,tag,iVar1,height2,0);
    canvas_fixlinesfor(glist,(t_text *)z);
  }
  return;
}

Assistant:

static void text_displace(t_gobj *z, t_glist *glist,
    int dx, int dy)
{
    t_text *x = (t_text *)z;
    x->te_xpix += dx;
    x->te_ypix += dy;
    if (glist_isvisible(glist))
    {
        t_rtext *y = glist_findrtext(glist, x);
        rtext_displace(y, glist->gl_zoom * dx, glist->gl_zoom * dy);
        text_drawborder(x, glist, rtext_gettag(y),
            rtext_width(y), rtext_height(y), 0);
        canvas_fixlinesfor(glist, x);
    }
}